

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* mocker::nasm::anon_unknown_52::merge
            (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *__return_storage_ptr__,
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            *lhs,vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 *rhs)

{
  pointer psVar1;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *extraout_RAX;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *pvVar2;
  shared_ptr<mocker::nasm::Register> *item;
  pointer __args;
  
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::vector(__return_storage_ptr__,lhs);
  psVar1 = (rhs->
           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = extraout_RAX;
  for (__args = (rhs->
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != psVar1; __args = __args + 1) {
    pvVar2 = (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              *)std::
                vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
                ::emplace_back<std::shared_ptr<mocker::nasm::Register>const&>
                          ((vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
                            *)__return_storage_ptr__,__args);
  }
  return pvVar2;
}

Assistant:

std::vector<std::shared_ptr<Register>>
merge(const std::vector<std::shared_ptr<Register>> &lhs,
      const std::vector<std::shared_ptr<Register>> &rhs) {
  auto res = lhs;
  for (auto &item : rhs)
    res.emplace_back(item);
  return res;
}